

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

LayoutBindingTestResult * __thiscall
glcts::AtomicCounterLayoutBindingCase::binding_examples_many_bindings
          (LayoutBindingTestResult *__return_storage_ptr__,AtomicCounterLayoutBindingCase *this)

{
  key_type *pkVar1;
  size_type *psVar2;
  pointer pbVar3;
  eStageType eVar4;
  pointer pcVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  ostream *poVar10;
  LayoutBindingProgram *pLVar11;
  mapped_type_conflict *pmVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _func_int **pp_Var13;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long *plVar14;
  undefined8 *puVar15;
  undefined8 uVar16;
  ulong uVar17;
  ulong uVar18;
  pointer pbVar19;
  undefined8 uVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  StringIntMap offsets;
  int max_bindings;
  StringVector list;
  StringVector list_1;
  IntVector expected;
  StringStream s;
  undefined1 local_330 [48];
  String local_300;
  LayoutBindingTestResult *local_2e0;
  LayoutBindingProgram *local_2d8;
  int local_2cc;
  undefined1 local_2c8 [24];
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  IProgramContextSupplier *local_2a8;
  code *local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  String local_278;
  vector<int,_std::allocator<int>_> local_258;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  pointer *local_218;
  long local_210;
  pointer local_208 [2];
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  undefined1 local_1d8 [112];
  undefined **local_168 [27];
  undefined8 local_90;
  undefined2 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  undefined4 extraout_var_00;
  
  local_2cc = 0;
  eVar4 = (this->super_LayoutBindingBaseCase).m_stage.type;
  local_2e0 = __return_storage_ptr__;
  iVar8 = (*((this->super_LayoutBindingBaseCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  uVar16 = 0x8264;
  if (eVar4 == FragmentShader) {
    uVar16 = 0x92d0;
  }
  uVar20 = 0x92cc;
  if (eVar4 != VertexShader) {
    uVar20 = uVar16;
  }
  (**(code **)(CONCAT44(extraout_var,iVar8) + 0x868))(uVar20,&local_2cc);
  std::ios_base::ios_base((ios_base *)local_168);
  local_2a0 = glUniformMatrix3x2fv;
  local_168[0] = (undefined **)glUniformMatrix3x2fv;
  local_90 = 0;
  local_88 = 0;
  local_80 = 0;
  uStack_78 = 0;
  local_70 = 0;
  uStack_68 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  local_1d8._0_8_ = &PTR__StringStream_02138dd0;
  local_168[0] = &PTR__StringStream_02138df8;
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(&local_300,this,0);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x1b])(local_330,this,&local_300);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
  if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
  }
  paVar21 = &local_300.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) != paVar21) {
    operator_delete((undefined1 *)
                    CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                    local_300.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  LayoutBindingBaseCase::setTemplateParam
            (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type,
             "UNIFORM_ACCESS",(String *)local_330);
  if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
  }
  StringStream::reset((StringStream *)local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d8,"layout(binding=2, offset=4) uniform atomic_uint;\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d8,"layout(binding=2) uniform atomic_uint ",0x26);
  (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [0x17])(local_330,this,0);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
  if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
  }
  std::__cxx11::stringbuf::str();
  LayoutBindingBaseCase::setTemplateParam
            (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type,
             "UNIFORM_DECL",(String *)local_330);
  if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
    operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
  }
  LayoutBindingBaseCase::updateTemplate
            (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type);
  local_2a8 = &(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier;
  iVar8 = (*(this->super_LayoutBindingBaseCase).super_IProgramContextSupplier.
            _vptr_IProgramContextSupplier[6])();
  pLVar11 = (LayoutBindingProgram *)CONCAT44(extraout_var_00,iVar8);
  bVar7 = LayoutBindingProgram::compiledAndLinked(pLVar11);
  if (bVar7) {
    local_2c8._0_8_ = (key_type *)0x0;
    local_2c8._8_8_ = (pointer)0x0;
    local_2c8._16_8_ = (pointer)0x0;
    (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
      _vptr_TestNode[0x17])(local_330,this,0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330);
    if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2c8);
    (*pLVar11->_vptr_LayoutBindingProgram[5])(local_330,pLVar11,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            *)local_330,(key_type *)local_2c8._0_8_);
    if (*pmVar12 == 4) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)local_330);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2c8);
      (*pLVar11->_vptr_LayoutBindingProgram[1])(pLVar11);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      std::ios_base::~ios_base((ios_base *)local_168);
      if (local_2cc < 2) {
LAB_00be4a73:
        std::ios_base::ios_base((ios_base *)local_168);
        local_168[0] = (undefined **)local_2a0;
        local_90 = 0;
        local_88 = 0;
        local_80 = 0;
        uStack_78 = 0;
        local_70 = 0;
        uStack_68 = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        local_1d8._0_8_ = &PTR__StringStream_02138dd0;
        local_168[0] = &PTR__StringStream_02138df8;
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&local_300,this,0);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x1b])(local_330,this,&local_300);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
            &local_300.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_
                                  ),local_300.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        LayoutBindingBaseCase::setTemplateParam
                  (&this->super_LayoutBindingBaseCase,
                   (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_ACCESS",
                   (String *)local_330);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        StringStream::reset((StringStream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"layout(binding=2, offset=4) uniform atomic_uint;\n",0x31);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"layout(offset=8) uniform atomic_uint ",0x25);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(local_330,this,0);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        std::__cxx11::stringbuf::str();
        LayoutBindingBaseCase::setTemplateParam
                  (&this->super_LayoutBindingBaseCase,
                   (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_DECL",
                   (String *)local_330);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        LayoutBindingBaseCase::updateTemplate
                  (&this->super_LayoutBindingBaseCase,
                   (this->super_LayoutBindingBaseCase).m_stage.type);
        iVar8 = (*local_2a8->_vptr_IProgramContextSupplier[6])();
        pLVar11 = (LayoutBindingProgram *)CONCAT44(extraout_var_02,iVar8);
        bVar7 = LayoutBindingProgram::compiledAndLinked(pLVar11);
        if (bVar7) {
          local_330._0_8_ = local_330 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_330,"should not compile","");
          local_2e0->m_passed = false;
          local_2e0->m_notRunForThisContext = false;
          (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2e0->m_reason,local_330._0_8_,
                     (char *)(local_330._0_8_ + local_330._8_8_));
          if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
            operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
          }
          (*pLVar11->_vptr_LayoutBindingProgram[1])(pLVar11);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
          std::ios_base::~ios_base((ios_base *)local_168);
          if (bVar7) {
            return local_2e0;
          }
        }
        else {
          (*pLVar11->_vptr_LayoutBindingProgram[1])(pLVar11);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
          std::ios_base::~ios_base((ios_base *)local_168);
        }
        std::ios_base::ios_base((ios_base *)local_168);
        local_168[0] = (undefined **)local_2a0;
        local_90 = 0;
        local_88 = 0;
        local_80 = 0;
        uStack_78 = 0;
        local_70 = 0;
        uStack_68 = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        local_1d8._0_8_ = &PTR__StringStream_02138dd0;
        local_168[0] = &PTR__StringStream_02138df8;
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(&local_300,this,0);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x1b])(local_330,this,&local_300);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
            &local_300.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_
                                  ),local_300.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        LayoutBindingBaseCase::setTemplateParam
                  (&this->super_LayoutBindingBaseCase,
                   (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_ACCESS",
                   (String *)local_330);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        StringStream::reset((StringStream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"layout(offset=4) uniform atomic_uint ",0x25);
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(local_330,this,0);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        std::__cxx11::stringbuf::str();
        LayoutBindingBaseCase::setTemplateParam
                  (&this->super_LayoutBindingBaseCase,
                   (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_DECL",
                   (String *)local_330);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        LayoutBindingBaseCase::updateTemplate
                  (&this->super_LayoutBindingBaseCase,
                   (this->super_LayoutBindingBaseCase).m_stage.type);
        iVar8 = (*local_2a8->_vptr_IProgramContextSupplier[6])();
        pLVar11 = (LayoutBindingProgram *)CONCAT44(extraout_var_03,iVar8);
        bVar7 = LayoutBindingProgram::compiledAndLinked(pLVar11);
        if (bVar7) {
          local_330._0_8_ = local_330 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_330,"should not compile","");
          local_2e0->m_passed = false;
          local_2e0->m_notRunForThisContext = false;
          (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2e0->m_reason,local_330._0_8_,
                     (char *)(local_330._0_8_ + local_330._8_8_));
          if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
            operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
          }
          (*pLVar11->_vptr_LayoutBindingProgram[1])(pLVar11);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
          std::ios_base::~ios_base((ios_base *)local_168);
          if (bVar7) {
            return local_2e0;
          }
        }
        else {
          (*pLVar11->_vptr_LayoutBindingProgram[1])(pLVar11);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
          std::ios_base::~ios_base((ios_base *)local_168);
        }
        if (1 < local_2cc) {
          iVar8 = 1;
          do {
            std::ios_base::ios_base((ios_base *)local_168);
            local_168[0] = (undefined **)local_2a0;
            local_90 = 0;
            local_88 = 0;
            local_70 = 0;
            uStack_68 = 0;
            local_80 = 0;
            uStack_78 = 0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
            paVar21 = &local_300.field_2;
            local_1d8._0_8_ = &PTR__StringStream_02138dd0;
            local_168[0] = &PTR__StringStream_02138df8;
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])(&local_300,this,0);
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x1b])((String *)local_330,this,&local_300);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
            if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
                paVar21) {
              operator_delete((undefined1 *)
                              CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                       local_300._M_dataplus._M_p._0_4_),
                              local_300.field_2._M_allocated_capacity + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])(&local_300,this,1);
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x1b])((String *)local_330,this,&local_300);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
            if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
                paVar21) {
              operator_delete((undefined1 *)
                              CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                       local_300._M_dataplus._M_p._0_4_),
                              local_300.field_2._M_allocated_capacity + 1);
            }
            if (iVar8 != 1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
              (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[0x17])(&local_300,this,2);
              (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[0x1b])((String *)local_330,this,&local_300);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
              if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
                operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
                  paVar21) {
                operator_delete((undefined1 *)
                                CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                         local_300._M_dataplus._M_p._0_4_),
                                local_300.field_2._M_allocated_capacity + 1);
              }
            }
            std::__cxx11::stringbuf::str();
            LayoutBindingBaseCase::setTemplateParam
                      (&this->super_LayoutBindingBaseCase,
                       (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_ACCESS",
                       (String *)local_330);
            if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            StringStream::reset((StringStream *)local_1d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,"layout(binding=1, offset=0) uniform atomic_uint ",0x30)
            ;
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])((String *)local_330,this,0);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
            if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,"layout(binding=2, offset=0) uniform atomic_uint ",0x30)
            ;
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])((String *)local_330,this,1);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
            if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            if (iVar8 != 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,"layout(binding=1, offset=0) uniform atomic_uint ",
                         0x30);
              (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[0x17])((String *)local_330,this,2);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
              if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
                operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
              }
            }
            std::__cxx11::stringbuf::str();
            LayoutBindingBaseCase::setTemplateParam
                      (&this->super_LayoutBindingBaseCase,
                       (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_DECL",
                       (String *)local_330);
            if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            LayoutBindingBaseCase::updateTemplate
                      (&this->super_LayoutBindingBaseCase,
                       (this->super_LayoutBindingBaseCase).m_stage.type);
            iVar9 = (*local_2a8->_vptr_IProgramContextSupplier[6])();
            pLVar11 = (LayoutBindingProgram *)CONCAT44(extraout_var_04,iVar9);
            bVar7 = LayoutBindingProgram::compiledAndLinked(pLVar11);
            if (iVar8 == 1) {
              if (!bVar7) {
                local_330._0_8_ = local_330 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_330,"should not compile","");
                local_2e0->m_passed = false;
                local_2e0->m_notRunForThisContext = false;
                (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2e0->m_reason,local_330._0_8_,
                           (char *)(local_330._0_8_ + local_330._8_8_));
LAB_00be5d2b:
                if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
                  operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                }
                (*pLVar11->_vptr_LayoutBindingProgram[1])(pLVar11);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
                goto LAB_00be4eaa;
              }
            }
            else if (bVar7) {
              LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)local_330,pLVar11,false);
              local_2e0->m_passed = true;
              local_2e0->m_notRunForThisContext = false;
              (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2e0->m_reason,local_330._0_8_,
                         (char *)(local_330._0_8_ + local_330._8_8_));
              goto LAB_00be5d2b;
            }
            (*pLVar11->_vptr_LayoutBindingProgram[1])(pLVar11);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
            std::ios_base::~ios_base((ios_base *)local_168);
            iVar8 = iVar8 + -1;
          } while (iVar8 == 0);
        }
        if (1 < local_2cc) {
          iVar8 = 1;
          do {
            paVar21 = &local_300.field_2;
            std::ios_base::ios_base((ios_base *)local_168);
            local_168[0] = (undefined **)local_2a0;
            local_90 = 0;
            local_88 = 0;
            local_70 = 0;
            uStack_68 = 0;
            local_80 = 0;
            uStack_78 = 0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
            local_1d8._0_8_ = &PTR__StringStream_02138dd0;
            local_168[0] = &PTR__StringStream_02138df8;
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])(&local_300,this,0);
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x1b])(local_330,this,&local_300);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
            if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
                paVar21) {
              operator_delete((undefined1 *)
                              CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                       local_300._M_dataplus._M_p._0_4_),
                              local_300.field_2._M_allocated_capacity + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])(&local_300,this,1);
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x1b])(local_330,this,&local_300);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
            if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
                paVar21) {
              operator_delete((undefined1 *)
                              CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                       local_300._M_dataplus._M_p._0_4_),
                              local_300.field_2._M_allocated_capacity + 1);
            }
            if (iVar8 != 1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
              (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[0x17])(&local_300,this,2);
              (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[0x1b])(local_330,this,&local_300);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
              if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
                operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
                  paVar21) {
                operator_delete((undefined1 *)
                                CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                         local_300._M_dataplus._M_p._0_4_),
                                local_300.field_2._M_allocated_capacity + 1);
              }
            }
            std::__cxx11::stringbuf::str();
            LayoutBindingBaseCase::setTemplateParam
                      (&this->super_LayoutBindingBaseCase,
                       (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_ACCESS",
                       (String *)local_330);
            if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            StringStream::reset((StringStream *)local_1d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,"layout(binding=1, offset=0) uniform atomic_uint ",0x30)
            ;
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])(local_330,this,0);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
            if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,"layout(binding=2, offset=0) uniform atomic_uint ",0x30)
            ;
            (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[0x17])(local_330,this,1);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
            if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            if (iVar8 != 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,"layout(binding=1, offset=2) uniform atomic_uint ",
                         0x30);
              (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[0x17])(local_330,this,2);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
              if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
                operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
              }
            }
            std::__cxx11::stringbuf::str();
            LayoutBindingBaseCase::setTemplateParam
                      (&this->super_LayoutBindingBaseCase,
                       (this->super_LayoutBindingBaseCase).m_stage.type,"UNIFORM_DECL",
                       (String *)local_330);
            if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
              operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
            }
            LayoutBindingBaseCase::updateTemplate
                      (&this->super_LayoutBindingBaseCase,
                       (this->super_LayoutBindingBaseCase).m_stage.type);
            iVar9 = (*local_2a8->_vptr_IProgramContextSupplier[6])();
            pLVar11 = (LayoutBindingProgram *)CONCAT44(extraout_var_05,iVar9);
            bVar7 = LayoutBindingProgram::compiledAndLinked(pLVar11);
            if (iVar8 == 1) {
              if (!bVar7) {
                local_330._0_8_ = local_330 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_330,"should not compile","");
                local_2e0->m_passed = false;
                local_2e0->m_notRunForThisContext = false;
                (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2e0->m_reason,local_330._0_8_,
                           (char *)(local_330._0_8_ + local_330._8_8_));
LAB_00be5e02:
                if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
                  operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
                }
                (*pLVar11->_vptr_LayoutBindingProgram[1])(pLVar11);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
                goto LAB_00be4eaa;
              }
            }
            else if (bVar7) {
              LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)local_330,pLVar11,false);
              local_2e0->m_passed = true;
              local_2e0->m_notRunForThisContext = false;
              (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2e0->m_reason,local_330._0_8_,
                         (char *)(local_330._0_8_ + local_330._8_8_));
              goto LAB_00be5e02;
            }
            (*pLVar11->_vptr_LayoutBindingProgram[1])(pLVar11);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
            std::ios_base::~ios_base((ios_base *)local_168);
            iVar8 = iVar8 + -1;
          } while (iVar8 == 0);
        }
        pp_Var13 = (_func_int **)(local_1d8 + 0x10);
        local_1d8._8_8_ = 0;
        local_1d8[0x10] = 0;
        local_2e0->m_passed = true;
        local_2e0->m_notRunForThisContext = false;
        (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
        local_1d8._0_8_ = pp_Var13;
        std::__cxx11::string::_M_construct<char*>((string *)&local_2e0->m_reason,pp_Var13,pp_Var13);
        if ((_func_int **)local_1d8._0_8_ == pp_Var13) {
          return local_2e0;
        }
        operator_delete((void *)local_1d8._0_8_,CONCAT71(local_1d8._17_7_,local_1d8[0x10]) + 1);
        return local_2e0;
      }
      std::ios_base::ios_base((ios_base *)local_168);
      local_168[0] = (undefined **)local_2a0;
      local_90 = 0;
      local_88 = 0;
      local_80 = 0;
      uStack_78 = 0;
      local_70 = 0;
      uStack_68 = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      local_1d8._0_8_ = &PTR__StringStream_02138dd0;
      local_168[0] = &PTR__StringStream_02138df8;
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(&local_300,this,0);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x1b])(local_330,this,&local_300);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) != paVar21)
      {
        operator_delete((undefined1 *)
                        CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                        local_300.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(&local_300,this,1);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x1b])(local_330,this,&local_300);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) != paVar21)
      {
        operator_delete((undefined1 *)
                        CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                        local_300.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(&local_300,this,2);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x1b])(local_330,this,&local_300);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) != paVar21)
      {
        operator_delete((undefined1 *)
                        CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                        local_300.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"+",1);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(&local_300,this,3);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x1b])(local_330,this,&local_300);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) != paVar21)
      {
        operator_delete((undefined1 *)
                        CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                        local_300.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      LayoutBindingBaseCase::setTemplateParam
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                 ,"UNIFORM_ACCESS",(String *)local_330);
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      StringStream::reset((StringStream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"layout(binding=3, offset=4) uniform atomic_uint ",0x30);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_330,this,0);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"layout(binding=2) uniform atomic_uint ",0x26);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_330,this,1);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"layout(binding=3) uniform atomic_uint ",0x26);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_330,this,2);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"layout(binding=2) uniform atomic_uint ",0x26);
      (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[0x17])(local_330,this,3);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d8,(char *)local_330._0_8_,local_330._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      std::__cxx11::stringbuf::str();
      LayoutBindingBaseCase::setTemplateParam
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                 ,"UNIFORM_DECL",(String *)local_330);
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      LayoutBindingBaseCase::updateTemplate
                (&this->super_LayoutBindingBaseCase,(this->super_LayoutBindingBaseCase).m_stage.type
                );
      iVar8 = (*local_2a8->_vptr_IProgramContextSupplier[6])();
      pLVar11 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar8);
      bVar7 = LayoutBindingProgram::compiledAndLinked(pLVar11);
      if (bVar7) {
        local_298.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_298.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_298.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2d8 = pLVar11;
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(local_330,this,0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_298,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(local_330,this,1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_298,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(local_330,this,2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_298,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        (*(this->super_LayoutBindingBaseCase).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[0x17])(local_330,this,3);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_298,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330);
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_60,&local_298);
        (*pLVar11->_vptr_LayoutBindingProgram[5])(local_330,pLVar11,&local_60);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_60);
        local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (int *)0x0;
        local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_300._M_dataplus._M_p._0_4_ = 4;
        std::vector<int,_std::allocator<int>_>::_M_insert_rval
                  (&local_258,(const_iterator)0x0,(value_type_conflict1 *)&local_300);
        local_300._M_dataplus._M_p._0_4_ = 0;
        std::vector<int,_std::allocator<int>_>::_M_insert_rval
                  (&local_258,
                   (const_iterator)
                   local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(value_type_conflict1 *)&local_300);
        local_300._M_dataplus._M_p._0_4_ = 8;
        std::vector<int,_std::allocator<int>_>::_M_insert_rval
                  (&local_258,
                   (const_iterator)
                   local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(value_type_conflict1 *)&local_300);
        local_300._M_dataplus._M_p._0_4_ = 4;
        std::vector<int,_std::allocator<int>_>::_M_insert_rval
                  (&local_258,
                   (const_iterator)
                   local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(value_type_conflict1 *)&local_300);
        if (local_298.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_298.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar17 = 0;
          uVar18 = 1;
          do {
            iVar8 = local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar17];
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                    *)local_330,
                                   local_298.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar17);
            if ((bVar7 & iVar8 == *pmVar12) == 0) {
              local_238 = local_228;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"offset of","");
              pcVar5 = local_298.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar17]._M_dataplus._M_p;
              local_1f8 = local_1e8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1f8,pcVar5,
                         pcVar5 + local_298.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar17]._M_string_length
                        );
              uVar18 = 0xf;
              if (local_238 != local_228) {
                uVar18 = local_228[0];
              }
              if (uVar18 < (ulong)(local_1f0 + local_230)) {
                uVar18 = 0xf;
                if (local_1f8 != local_1e8) {
                  uVar18 = local_1e8[0];
                }
                if (uVar18 < (ulong)(local_1f0 + local_230)) goto LAB_00be5c90;
                plVar14 = (long *)std::__cxx11::string::replace
                                            ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_238);
              }
              else {
LAB_00be5c90:
                plVar14 = (long *)std::__cxx11::string::_M_append
                                            ((char *)&local_238,(ulong)local_1f8);
              }
              local_2c8._0_8_ = local_2c8 + 0x10;
              pkVar1 = (key_type *)(plVar14 + 2);
              if ((key_type *)*plVar14 == pkVar1) {
                local_2c8._16_8_ = (pkVar1->_M_dataplus)._M_p;
                uStack_2b0 = (undefined4)plVar14[3];
                uStack_2ac = *(undefined4 *)((long)plVar14 + 0x1c);
              }
              else {
                local_2c8._16_8_ = (pkVar1->_M_dataplus)._M_p;
                local_2c8._0_8_ = (key_type *)*plVar14;
              }
              local_2c8._8_8_ = plVar14[1];
              *plVar14 = (long)pkVar1;
              plVar14[1] = 0;
              *(undefined1 *)&(pkVar1->_M_dataplus)._M_p = 0;
              local_218 = local_208;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_218,"did not match requested","");
              pbVar3 = (pointer)((long)&((_Alloc_hider *)local_2c8._8_8_)->_M_p + local_210);
              pbVar19 = (pointer)0xf;
              if ((key_type *)local_2c8._0_8_ != (key_type *)(local_2c8 + 0x10)) {
                pbVar19 = (pointer)local_2c8._16_8_;
              }
              if (pbVar19 < pbVar3) {
                pbVar19 = (pointer)0xf;
                if (local_218 != local_208) {
                  pbVar19 = local_208[0];
                }
                if (pbVar19 < pbVar3) goto LAB_00be5f1d;
                puVar15 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_218,0,(char *)0x0,local_2c8._0_8_);
              }
              else {
LAB_00be5f1d:
                puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_2c8,(ulong)local_218);
              }
              local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
              psVar2 = puVar15 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar15 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar2) {
                local_278.field_2._M_allocated_capacity = *psVar2;
                local_278.field_2._8_8_ = puVar15[3];
              }
              else {
                local_278.field_2._M_allocated_capacity = *psVar2;
                local_278._M_dataplus._M_p = (pointer)*puVar15;
              }
              local_278._M_string_length = puVar15[1];
              *puVar15 = psVar2;
              puVar15[1] = 0;
              *(undefined1 *)psVar2 = 0;
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                      *)local_330,
                                     local_298.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar17);
              LayoutBindingBaseCase::generateLog<int,int>
                        (&local_300,&this->super_LayoutBindingBaseCase,&local_278,*pmVar12,4);
              local_2e0->m_passed = false;
              local_2e0->m_notRunForThisContext = false;
              (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2e0->m_reason,
                         CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_)
                         ,local_300._M_string_length +
                          CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_
                                  ));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
                  &local_300.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_300._M_dataplus._M_p._4_4_,
                                         local_300._M_dataplus._M_p._0_4_),
                                local_300.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._M_dataplus._M_p != &local_278.field_2) {
                operator_delete(local_278._M_dataplus._M_p,
                                local_278.field_2._M_allocated_capacity + 1);
              }
              if (local_218 != local_208) {
                operator_delete(local_218,(ulong)((long)&(local_208[0]->_M_dataplus)._M_p + 1));
              }
              if ((key_type *)local_2c8._0_8_ != (key_type *)(local_2c8 + 0x10)) {
                operator_delete((void *)local_2c8._0_8_,
                                (ulong)((long)&((_Alloc_hider *)local_2c8._16_8_)->_M_p + 1));
              }
              pLVar11 = local_2d8;
              if (local_1f8 != local_1e8) {
                operator_delete(local_1f8,local_1e8[0] + 1);
              }
              if (local_238 != local_228) {
                operator_delete(local_238,local_228[0] + 1);
              }
              if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_258.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_258.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)local_330);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_298);
              (*pLVar11->_vptr_LayoutBindingProgram[1])(pLVar11);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
              goto LAB_00be4eaa;
            }
            bVar7 = true;
            bVar6 = uVar18 < (ulong)((long)local_298.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_298.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar17 = uVar18;
            uVar18 = (ulong)((int)uVar18 + 1);
          } while (bVar6);
        }
        if (local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_258.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)local_330);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_298);
        (*local_2d8->_vptr_LayoutBindingProgram[1])();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base((ios_base *)local_168);
        goto LAB_00be4a73;
      }
      LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)local_330,pLVar11,false);
      local_2e0->m_passed = false;
      local_2e0->m_notRunForThisContext = false;
      (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e0->m_reason,local_330._0_8_,
                 (char *)(local_330._0_8_ + local_330._8_8_));
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      pp_Var13 = pLVar11->_vptr_LayoutBindingProgram;
      goto LAB_00be4e90;
    }
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,"offset did not match requested","");
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            *)local_330,(key_type *)local_2c8._0_8_);
    LayoutBindingBaseCase::generateLog<int,int>
              (&local_300,&this->super_LayoutBindingBaseCase,&local_278,*pmVar12,1);
    local_2e0->m_passed = false;
    local_2e0->m_notRunForThisContext = false;
    (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0->m_reason,
               CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
               local_300._M_string_length +
               CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_) !=
        &local_300.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_),
                      local_300.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)local_330);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2c8);
  }
  else {
    LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)local_330,pLVar11,false);
    local_2e0->m_passed = false;
    local_2e0->m_notRunForThisContext = false;
    (local_2e0->m_reason)._M_dataplus._M_p = (pointer)&(local_2e0->m_reason).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0->m_reason,local_330._0_8_,
               (char *)(local_330._0_8_ + local_330._8_8_));
    if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
  }
  pp_Var13 = pLVar11->_vptr_LayoutBindingProgram;
LAB_00be4e90:
  (*pp_Var13[1])(pLVar11);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
LAB_00be4eaa:
  std::ios_base::~ios_base((ios_base *)local_168);
  return local_2e0;
}

Assistant:

LayoutBindingTestResult binding_examples_many_bindings(void)
	{
		int max_bindings = 0;

		if (isStage(VertexShader))
		{
			gl().getIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTER_BUFFERS, &max_bindings);
		}
		else if (isStage(FragmentShader))
		{
			gl().getIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS, &max_bindings);
		}
		else
		{
			gl().getIntegerv(GL_MAX_COMPUTE_ATOMIC_COUNTER_BUFFERS, &max_bindings);
		}

		// example 1 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=2, offset=4) uniform atomic_uint;\n";
			s << "layout(binding=2) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}

			StringVector list;
			list.push_back(getDefaultUniformName());

			StringIntMap offsets = program->getOffsets(list);
			passed &= (4 == offsets[list[0]]);
			if (!passed)
			{
				return LayoutBindingTestResult(
					passed, generateLog(String("offset did not match requested"), offsets[list[0]], 1));
			}
		}

		// example 2 in atomic counter CTS spec ac-binding-examples
		if (max_bindings >= 2)
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			s << "+" << buildAccess(getDefaultUniformName(1)) << ";\n";
			s << "+" << buildAccess(getDefaultUniformName(2)) << ";\n";
			s << "+" << buildAccess(getDefaultUniformName(3)) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=3, offset=4) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			s << "layout(binding=2) uniform atomic_uint " << getDefaultUniformName(1) << ";\n";
			s << "layout(binding=3) uniform atomic_uint " << getDefaultUniformName(2) << ";\n";
			s << "layout(binding=2) uniform atomic_uint " << getDefaultUniformName(3) << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (!passed)
			{
				return LayoutBindingTestResult(passed, program->getErrorLog());
			}

			StringVector list;
			list.push_back(getDefaultUniformName());
			list.push_back(getDefaultUniformName(1));
			list.push_back(getDefaultUniformName(2));
			list.push_back(getDefaultUniformName(3));

			StringIntMap offsets = program->getOffsets(list);
			IntVector	expected;
			expected.insert(expected.end(), 4);
			expected.insert(expected.end(), 0);
			expected.insert(expected.end(), 8);
			expected.insert(expected.end(), 4);
			for (unsigned int idx = 0; idx < list.size(); idx++)
			{
				passed &= (expected[idx] == offsets[list[idx]]);
				if (!passed)
				{
					return LayoutBindingTestResult(
						passed, generateLog(String("offset of") + String(list[idx]) + String("did not match requested"),
											offsets[list[idx]], 4));
				}
			}
		}

		// example 3 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(binding=2, offset=4) uniform atomic_uint;\n";
			s << "layout(offset=8) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (passed)
			{
				return LayoutBindingTestResult(!passed, String("should not compile"));
			}
		}

		// example 4 in atomic counter CTS spec ac-binding-examples
		{
			bool		 passed = true;
			StringStream s;
			s << buildAccess(getDefaultUniformName()) << ";\n";
			setTemplateParam("UNIFORM_ACCESS", s.str());

			s.reset();
			s << "layout(offset=4) uniform atomic_uint " << getDefaultUniformName() << ";\n";
			setTemplateParam("UNIFORM_DECL", s.str());
			updateTemplate();

			LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
			passed &= program->compiledAndLinked();
			if (passed)
			{
				return LayoutBindingTestResult(!passed, String("should not compile"));
			}
		}

		// example 5 in atomic counter CTS spec ac-binding-examples
		// first check working example, then amend it with an error
		if (max_bindings >= 2)
		{
			for (int pass = 0; pass < 2; pass++)
			{
				bool passed = true;

				StringStream s;
				s << buildAccess(getDefaultUniformName()) << ";\n";
				s << "+" << buildAccess(getDefaultUniformName(1)) << ";\n";
				if (pass)
					s << "+" << buildAccess(getDefaultUniformName(2)) << ";\n";
				setTemplateParam("UNIFORM_ACCESS", s.str());

				s.reset();
				s << "layout(binding=1, offset=0) uniform atomic_uint " << getDefaultUniformName() << ";\n";
				s << "layout(binding=2, offset=0) uniform atomic_uint " << getDefaultUniformName(1) << ";\n";
				if (pass)
					s << "layout(binding=1, offset=0) uniform atomic_uint " << getDefaultUniformName(2) << ";\n";
				setTemplateParam("UNIFORM_DECL", s.str());
				updateTemplate();

				LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
				passed &= program->compiledAndLinked();
				if (pass != 0)
				{
					if (passed)
					{
						return LayoutBindingTestResult(passed, program->getErrorLog());
					}
				}
				else
				{
					if (!passed)
					{
						return LayoutBindingTestResult(passed, String("should not compile"));
					}
				}
			}
		}

		// example 6 in atomic counter CTS spec ac-binding-examples
		// first check working example, then amend it with an error
		if (max_bindings >= 2)
		{
			for (int pass = 0; pass < 2; pass++)
			{
				bool passed = true;

				StringStream s;
				s << buildAccess(getDefaultUniformName()) << ";\n";
				s << "+" << buildAccess(getDefaultUniformName(1)) << ";\n";
				if (pass)
					s << "+" << buildAccess(getDefaultUniformName(2)) << ";\n";
				setTemplateParam("UNIFORM_ACCESS", s.str());

				s.reset();
				s << "layout(binding=1, offset=0) uniform atomic_uint " << getDefaultUniformName() << ";\n";
				s << "layout(binding=2, offset=0) uniform atomic_uint " << getDefaultUniformName(1) << ";\n";
				if (pass)
					s << "layout(binding=1, offset=2) uniform atomic_uint " << getDefaultUniformName(2) << ";\n";
				setTemplateParam("UNIFORM_DECL", s.str());
				updateTemplate();

				LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
				passed &= program->compiledAndLinked();
				if (pass != 0)
				{
					if (passed)
					{
						return LayoutBindingTestResult(passed, program->getErrorLog());
					}
				}
				else
				{
					if (!passed)
					{
						return LayoutBindingTestResult(passed, String("should not compile"));
					}
				}
			}
		}

		return true;
	}